

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFmap.c
# Opt level: O3

NF_link_map * NF_map(NF_list *nl,int mode,void *addr)

{
  anon_union_8_2_f9000a74_for_d_un *paVar1;
  void *__s;
  long *plVar2;
  byte bVar3;
  ushort uVar4;
  Elf64_Word EVar5;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  ulong uVar9;
  Elf64_Dyn *pEVar10;
  byte bVar11;
  long lVar12;
  Elf64_Xword EVar13;
  int iVar14;
  Elf64_Phdr *pEVar15;
  ssize_t sVar16;
  uint *puVar17;
  Elf64_Dyn *pEVar18;
  Elf64_Phdr *pEVar19;
  NF_link_map *pNVar20;
  long lVar21;
  char *pcVar22;
  long lVar23;
  ulong uVar24;
  Elf64_Dyn **ppEVar25;
  uint uVar26;
  void *__s_00;
  size_t sVar27;
  ulong *puVar28;
  void *pvVar29;
  ulong *puVar30;
  uint uVar31;
  void *pvVar32;
  long lVar33;
  undefined1 auVar34 [16];
  long alStack_b0 [5];
  long alStack_88 [6];
  NF_link_map *local_58;
  ulong local_50;
  Elf64_Phdr *local_48;
  undefined8 uStack_40;
  NF_list *local_38;
  
  pNVar20 = nl->map;
  sVar27 = pNVar20->l_phlen;
  alStack_88[5] = 0x103806;
  local_48 = (Elf64_Phdr *)malloc(sVar27);
  alStack_88[5] = 0x103821;
  local_38 = nl;
  pread(nl->fd,local_48,sVar27,pNVar20->l_phoff);
  uVar4 = pNVar20->l_phnum;
  lVar12 = -(ulong)((uint)uVar4 * 0x30);
  puVar30 = (ulong *)((long)&local_58 + lVar12);
  if (uVar4 == 0) {
LAB_00103c3a:
    pcVar22 = "Wrong type of shared object or ELF: LOAD segment less than 2";
  }
  else {
    pEVar15 = local_48 + uVar4;
    uVar31 = 0;
    uVar26 = 0;
    pEVar19 = local_48;
    do {
      EVar5 = pEVar19->p_type;
      if (EVar5 == 6) {
        pNVar20->l_phdr = (Elf64_Phdr *)pEVar19->p_vaddr;
      }
      else if (EVar5 == 2) {
        pNVar20->l_ld = (Elf64_Dyn *)pEVar19->p_vaddr;
        pNVar20->l_ldnum = (uint16_t)((uint)pEVar19->p_memsz >> 4);
      }
      else if (EVar5 == 1) {
        lVar21 = (long)(int)uVar31;
        lVar23 = lVar21 * 0x30;
        uVar24 = pEVar19->p_vaddr;
        puVar30[lVar21 * 6] = uVar24 & 0xfffffffffffff000;
        EVar13 = pEVar19->p_memsz;
        auVar34._8_4_ = (int)uVar24;
        auVar34._0_8_ = uVar24;
        auVar34._12_4_ = (int)(uVar24 >> 0x20);
        lVar33 = uVar24 + pEVar19->p_filesz;
        *(ulong *)((long)&local_50 + lVar23 + lVar12) = lVar33 + 0xfffU & 0xfffffffffffff000;
        plVar2 = (long *)((long)&local_48 + lVar23 + lVar12);
        *plVar2 = lVar33;
        plVar2[1] = auVar34._8_8_ + EVar13;
        *(Elf64_Off *)((long)&local_38 + lVar23 + lVar12) = pEVar19->p_offset & 0xfffffffffffff000;
        if (0 < (int)uVar31) {
          uVar26 = (uint)(byte)((byte)uVar26 |
                               puVar30[lVar21 * 6 + -5] != (uVar24 & 0xfffffffffffff000));
        }
        uVar31 = uVar31 + 1;
        bVar3 = (byte)pEVar19->p_flags;
        bVar11 = bVar3 << 4;
        *(uint *)(puVar30 + lVar21 * 6 + 5) =
             (uint)((byte)((bVar11 | bVar3 >> 4) * '\x02' & 0x40 |
                          ((bVar11 & 0x10) << 2 | (bVar11 & 0x40) >> 2) * '\x02') >> 5);
      }
      pEVar19 = pEVar19 + 1;
    } while (pEVar19 < pEVar15);
    if ((int)uVar31 < 2) goto LAB_00103c3a;
    uStack_40._4_4_ = uVar26;
    if (addr != (void *)0x0) {
      local_50 = *puVar30;
      sVar27 = *(long *)((long)alStack_88 + (long)(int)uVar31 * 0x30 + lVar12 + 0x18) - *puVar30;
      local_38 = (NF_list *)CONCAT44(local_38._4_4_,local_38->fd);
      uVar26 = *(uint *)(&stack0xffffffffffffffd0 + lVar12);
      *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x10398b;
      iVar14 = mprotect(addr,sVar27,uVar26 | 2);
      if (iVar14 == 0) {
        pNVar20->l_map_start = (uint64_t)addr;
        pNVar20->l_map_end = sVar27 + (long)addr;
        pNVar20->l_addr = (long)addr - local_50;
        if ((uStack_40._4_4_ & 1) != 0) {
          lVar21 = *(long *)((long)alStack_b0 + (ulong)uVar31 * 0x30 + lVar12);
          lVar23 = *(long *)((long)alStack_88 + (ulong)uVar31 * 0x30 + lVar12);
          *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x1039d0;
          mprotect((void *)(((long)addr - local_50) + lVar21),lVar23 - lVar21,0);
        }
        puVar28 = puVar30 + (ulong)uVar31 * 6;
        local_58 = pNVar20;
        do {
          uVar24 = *puVar30;
          uVar7 = puVar30[1];
          uVar8 = pNVar20->l_addr;
          uVar9 = puVar30[4];
          *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103a00;
          sVar16 = pread((int)local_38,(void *)(uVar8 + uVar24),uVar7 - uVar24,uVar9);
          if (sVar16 < 0) {
            pcVar22 = pNVar20->l_name;
            *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103c1d;
            puVar17 = (uint *)__errno_location();
            uVar26 = *puVar17;
            *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103c30;
            printf("error when reading library %s, and the errno is %d",pcVar22,(ulong)uVar26);
            goto LAB_00103c30;
          }
          uVar24 = *puVar30;
          uVar7 = puVar30[1];
          uVar8 = pNVar20->l_addr;
          uVar9 = puVar30[5];
          *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103a25;
          mprotect((void *)(uVar8 + uVar24),uVar7 - uVar24,(uint)uVar9 | 2);
          if (pNVar20->l_phdr == (Elf64_Phdr *)0x0) {
            uVar24 = pNVar20->l_phoff;
            uVar7 = puVar30[4];
            if ((uVar7 <= uVar24) &&
               ((ulong)pNVar20->l_phnum * 0x38 + uVar24 <= (uVar7 + puVar30[1]) - *puVar30)) {
              pNVar20->l_phdr = (Elf64_Phdr *)((uVar24 - uVar7) + *puVar30);
            }
          }
          uVar24 = puVar30[2];
          if (uVar24 < puVar30[3]) {
            uVar8 = pNVar20->l_addr;
            __s = (void *)(uVar8 + uVar24);
            pvVar32 = (void *)(puVar30[3] + uVar8);
            pvVar29 = (void *)(uVar8 + uVar24 + 0xfff & 0xfffffffffffff000);
            __s_00 = pvVar29;
            if (pvVar32 < pvVar29) {
              __s_00 = pvVar32;
            }
            if (__s <= __s_00 && (long)__s_00 - (long)__s != 0) {
              *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103aa5;
              memset(__s,0,(long)__s_00 - (long)__s);
            }
            pNVar20 = local_58;
            if (pvVar29 < pvVar32) {
              *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103acf;
              memset(__s_00,0,((long)pvVar32 + 0xfffU & 0xfffffffffffff000) - (long)__s_00);
            }
          }
          puVar30 = puVar30 + 6;
        } while (puVar30 < puVar28);
        if (pNVar20->l_phdr != (Elf64_Phdr *)0x0) {
          local_48 = pNVar20->l_phdr;
        }
        uVar8 = pNVar20->l_addr;
        pEVar10 = pNVar20->l_ld;
        pNVar20->l_phdr = (Elf64_Phdr *)((long)&local_48->p_type + uVar8);
        pEVar18 = (Elf64_Dyn *)((long)&pEVar10->d_tag + uVar8);
        pNVar20->l_ld = pEVar18;
        uVar24 = *(ulong *)((long)&pEVar10->d_tag + uVar8);
        if (uVar24 != 0) {
          do {
            if (uVar24 < 0x23) {
              ppEVar25 = pNVar20->l_info + uVar24;
LAB_00103b40:
              *ppEVar25 = pEVar18;
            }
            else {
              ppEVar25 = pNVar20->l_info + 0x22;
              if ((uVar24 == 0x6ffffff9) ||
                 (ppEVar25 = pNVar20->l_info + 0x23, uVar24 == 0x6ffffef5)) goto LAB_00103b40;
            }
            uVar24 = pEVar18[1].d_tag;
            pEVar18 = pEVar18 + 1;
          } while (uVar24 != 0);
        }
        if (pNVar20->l_info[6] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[6]->d_un;
          paVar1->d_val = paVar1->d_val + uVar8;
        }
        if (pNVar20->l_info[5] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[5]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        if (pNVar20->l_info[7] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[7]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        if (pNVar20->l_info[0x17] != (Elf64_Dyn *)0x0) {
          paVar1 = &pNVar20->l_info[0x17]->d_un;
          paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        }
        paVar1 = &pNVar20->l_info[0x23]->d_un;
        paVar1->d_val = paVar1->d_val + pNVar20->l_addr;
        puVar17 = (uint *)(pNVar20->l_info[0x23]->d_un).d_val;
        uVar26 = *puVar17;
        pNVar20->l_nbuckets = uVar26;
        uVar31 = puVar17[1];
        uVar6 = puVar17[2];
        pNVar20->l_gnu_bitmask_idxbits = uVar6 - 1;
        pNVar20->l_gnu_shift = puVar17[3];
        pNVar20->l_gnu_bitmask = (Elf64_Addr *)(puVar17 + 4);
        pNVar20->l_gnu_buckets = puVar17 + (ulong)(uVar6 * 2) + 4;
        pNVar20->l_gnu_chain_zero =
             puVar17 + (ulong)(uVar6 * 2) + 4 + ((ulong)uVar26 - (ulong)uVar31);
        return pNVar20;
      }
      *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103c56;
      puVar17 = (uint *)__errno_location();
      uVar26 = *puVar17;
      *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103c66;
      printf("error when calling mprotect, and the error code is %d\n",(ulong)uVar26);
      goto LAB_00103c30;
    }
    pcVar22 = "please map the so in a malloc\'d region";
  }
  *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103c4f;
  puts(pcVar22);
LAB_00103c30:
  *(undefined8 *)((long)alStack_88 + lVar12 + 0x28) = 0x103c3a;
  exit(-1);
}

Assistant:

struct NF_link_map *NF_map(struct NF_list *nl, int mode, void *addr)
{
    //int fd;

    /* TODO: actually serach directories here */
    //fd = open(file, O_RDONLY, 0);
    /* it may help to know the SONAME and REALNAME of a so */

    //struct filebuf fb;

    /* just cram into buf as much as you can */
    /* use a do-while can assure this event won't be interrupted */
    //size_t retlen = read(fd, fb.buf, sizeof(fb.buf) - fb.len);

    /* the information we get from ehdr is merely phnum, total length of all program headers, and offset for program headers
     * so we dump filebuf in NF_list, instead it is added as NF_link_map members
     * also ``Elf64_Addr`` is always sufficient for ``maplength``, for it is a memory length
     */
    //Elf64_Ehdr *ehdr = (Elf64_Ehdr *)nl->fb.buf;
    //size_t maplength = ehdr->e_phnum * sizeof(Elf64_Phdr);

    /* create a new link map, and fill in header table info */
    //struct NF_link_map *l = calloc(sizeof(struct NF_link_map), 1);
    //l->l_phnum = ehdr->e_phnum;

    /* note that in dl-load: open_verify 
     * That function open an file with a little bit check to the phdrs
     * And the same thing just appear once again in _dl_map_object_from_fd
     */
    /* store the phdrs on heap for further loading */
    //Elf64_Phdr *phdr = malloc(maplength);
    //pread(nl->fd, (void *)phdr, maplength, ehdr->e_phoff);

    struct NF_link_map *l = nl->map;
    Elf64_Phdr *phdr = malloc(l->l_phlen);
    pread(nl->fd, (void *)phdr, l->l_phlen, l->l_phoff);

    struct loadcmd loadcmds[l->l_phnum];
    int nloadcmds = 0;
    bool has_holes = false;

    Elf64_Phdr *ph;
    /* travese the segments! */
    for (ph = phdr; ph < &phdr[l->l_phnum]; ++ph)
    {
        switch (ph->p_type)
        {
        case PT_LOAD:
        {
            /* load and add it to loadcmds */
            struct loadcmd *c = &loadcmds[nloadcmds++]; //get the current loaction in loadcmds
            /* TODO: pagesize are set to 4096 for simplicity */
            c->mapstart = ALIGN_DOWN(ph->p_vaddr, 4096);
            c->mapend = ALIGN_UP(ph->p_vaddr + ph->p_filesz, 4096);
            c->dataend = ph->p_vaddr + ph->p_filesz;
            c->allocend = ph->p_vaddr + ph->p_memsz;
            c->mapoff = ALIGN_DOWN(ph->p_offset, 4096);

            /* hey ELF, is it your last segment? */
            if (nloadcmds > 1 && c[-1].mapend != c->mapstart)
                has_holes = true;

            /* setting the protection of this segment. may have errors */
            c->prot = 0;
            c->prot |= (ph->p_flags & PF_R) >> 2;
            c->prot |= ph->p_flags & PF_W;
            c->prot |= (ph->p_flags & PF_X) << 2;

            break;
        }
        case PT_PHDR:
            /* the PHT itself, usually the first one */
            /* or it may not exist at all, in which case it says "use ld.so to find it in a LOAD segment" */
            l->l_phdr = (void *)ph->p_vaddr;
            break;

        case PT_DYNAMIC:
            /* the dynamic section */
            l->l_ld = (void *)ph->p_vaddr;
            l->l_ldnum = ph->p_memsz / sizeof(Elf64_Dyn);
            break;

        default:
            break;
        }
    }

    /* now map LOAD segments into memory */
    size_t maplength = loadcmds[nloadcmds - 1].allocend - loadcmds[0].mapstart;
    map_segments(l, addr, loadcmds, nloadcmds, has_holes, nl->fd, maplength);

    if (l->l_phdr == NULL)
        /* This is expected. I don't know why l_phdr is not allocated 
     * It's probably because of capatiabilty issue, sigh
     */
        l->l_phdr = phdr;

    /* After loading, the absolute address is set, now relocate the PHT */
    l->l_phdr = (Elf64_Phdr *)((Elf64_Addr)l->l_phdr + l->l_addr);

    /* rebasing ld to prevent SIGSEGV */
    l->l_ld = (Elf64_Dyn *)((Elf64_Addr)l->l_ld + l->l_addr);
    /* indexing the l_ld into l_info */
    fill_info(l);

    setup_hash(l);

    return l;
}